

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxMainSM(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *old)

{
  Result RVar1;
  int32_t iVar2;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  byte bVar6;
  
  bVar6 = 0;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSimplifier(&this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&old->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 );
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  )._vptr_SPxSimplifier = (_func_int **)&PTR__SPxMainSM_006b3b98;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&(this->m_prim).val,&(old->m_prim).val);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&(this->m_slack).val,&(old->m_slack).val);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&(this->m_dual).val,&(old->m_dual).val);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(&(this->m_redCost).val,&(old->m_redCost).val);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray(&this->m_cBasisStat,&old->m_cBasisStat);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray(&this->m_rBasisStat,&old->m_rBasisStat);
  DataArray<int>::DataArray(&this->m_cIdx,&old->m_cIdx);
  DataArray<int>::DataArray(&this->m_rIdx,&old->m_rIdx);
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  ::Array(&this->m_hist,&old->m_hist);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_classSetRows,0);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_classSetCols,0);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_dupRows,0);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array(&this->m_dupCols,0);
  this->m_postsolved = old->m_postsolved;
  DataArray<int>::DataArray(&this->m_stat,&old->m_stat);
  this->m_thesense = old->m_thesense;
  this->m_keepbounds = old->m_keepbounds;
  RVar1 = old->m_result;
  this->m_addedcols = old->m_addedcols;
  this->m_result = RVar1;
  pnVar4 = &old->m_cutoffbound;
  pnVar5 = &this->m_cutoffbound;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_cutoffbound).m_backend.exp = (old->m_cutoffbound).m_backend.exp;
  (this->m_cutoffbound).m_backend.neg = (old->m_cutoffbound).m_backend.neg;
  iVar2 = (old->m_cutoffbound).m_backend.prec_elem;
  (this->m_cutoffbound).m_backend.fpclass = (old->m_cutoffbound).m_backend.fpclass;
  (this->m_cutoffbound).m_backend.prec_elem = iVar2;
  pnVar4 = &old->m_pseudoobj;
  pnVar5 = &this->m_pseudoobj;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)(pnVar5->m_backend).data._M_elems =
         *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar4 + (ulong)bVar6 * -0x10 + 8);
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_pseudoobj).m_backend.exp = (old->m_pseudoobj).m_backend.exp;
  (this->m_pseudoobj).m_backend.neg = (old->m_pseudoobj).m_backend.neg;
  iVar2 = (old->m_pseudoobj).m_backend.prec_elem;
  (this->m_pseudoobj).m_backend.fpclass = (old->m_pseudoobj).m_backend.fpclass;
  (this->m_pseudoobj).m_backend.prec_elem = iVar2;
  return;
}

Assistant:

SPxMainSM(const SPxMainSM& old)
      : SPxSimplifier<R>(old)
      , m_prim(old.m_prim)
      , m_slack(old.m_slack)
      , m_dual(old.m_dual)
      , m_redCost(old.m_redCost)
      , m_cBasisStat(old.m_cBasisStat)
      , m_rBasisStat(old.m_rBasisStat)
      , m_cIdx(old.m_cIdx)
      , m_rIdx(old.m_rIdx)
      , m_hist(old.m_hist)
      , m_postsolved(old.m_postsolved)
      , m_stat(old.m_stat)
      , m_thesense(old.m_thesense)
      , m_keepbounds(old.m_keepbounds)
      , m_addedcols(old.m_addedcols)
      , m_result(old.m_result)
      , m_cutoffbound(old.m_cutoffbound)
      , m_pseudoobj(old.m_pseudoobj)
   {
      ;
   }